

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_35995e::DirectoryTreeSignatureTask::inputsAvailable
          (DirectoryTreeSignatureTask *this,TaskInterface ti)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  pointer pSVar1;
  SubpathInfo *info;
  pointer pSVar2;
  hash_combine_recursive_helper helper;
  hash_code local_e0;
  ValueType local_d8;
  TaskInterface local_c0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [80];
  char *local_50;
  uint64_t uStack_48;
  
  local_c0.ctx = ti.ctx;
  local_c0.impl = ti.impl;
  first._M_current = (this->path)._M_dataplus._M_p;
  local_e0 = llvm::hashing::detail::
             hash_combine_range_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       (first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(first._M_current + (this->path)._M_string_length));
  local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)llvm::hashing::detail::
                hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )(this->directoryValue).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )(this->directoryValue).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
            ((hash_combine_recursive_helper *)local_b0);
  local_e0 = llvm::hashing::detail::hash_combine_recursive_helper::
             combine<llvm::hash_code,llvm::hash_code>
                       ((hash_combine_recursive_helper *)local_b0,0,(char *)local_b0,
                        (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_a0)->asOutputInfo
                                 ).checksum,&local_e0,(hash_code *)&local_d8);
  pSVar2 = (this->childResults).
           super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->childResults).
           super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar2 != pSVar1) {
    do {
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)llvm::hashing::detail::
                    hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )(pSVar2->value).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )(pSVar2->value).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
      llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
                ((hash_combine_recursive_helper *)local_b0);
      local_e0 = llvm::hashing::detail::hash_combine_recursive_helper::
                 combine<llvm::hash_code,llvm::hash_code>
                           ((hash_combine_recursive_helper *)local_b0,0,(char *)local_b0,
                            (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_a0)->
                                     asOutputInfo).checksum,&local_e0,(hash_code *)&local_d8);
      if ((pSVar2->directorySignatureValue).Storage.hasVal == true) {
        local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)llvm::hashing::detail::
                      hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )*(uchar **)
                                    (pSVar2->directorySignatureValue).Storage.storage.
                                    super_AlignedCharArray<8UL,_24UL>.buffer,
                                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  )*(uchar **)
                                    ((pSVar2->directorySignatureValue).Storage.storage.
                                     super_AlignedCharArray<8UL,_24UL>.buffer + 8));
        llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
                  ((hash_combine_recursive_helper *)local_b0);
        local_e0 = llvm::hashing::detail::hash_combine_recursive_helper::
                   combine<llvm::hash_code,llvm::hash_code>
                             ((hash_combine_recursive_helper *)local_b0,0,(char *)local_b0,
                              (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_a0)->
                                       asOutputInfo).checksum,&local_e0,(hash_code *)&local_d8);
      }
      else {
        local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xc183979c3e98722e;
        llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
                  ((hash_combine_recursive_helper *)local_b0);
        local_e0 = llvm::hashing::detail::hash_combine_recursive_helper::
                   combine<llvm::hash_code,unsigned_long>
                             ((hash_combine_recursive_helper *)local_b0,0,(char *)local_b0,
                              (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_a0)->
                                       asOutputInfo).checksum,&local_e0,(unsigned_long *)&local_d8);
      }
      pSVar2 = pSVar2 + 1;
    } while (pSVar2 != pSVar1);
  }
  local_b0._0_4_ = DirectoryTreeSignature;
  local_b0._4_4_ = 0;
  local_a0._0_8_ = 0;
  local_a0._8_8_ = 0;
  local_a0._16_8_ = 0;
  local_a0._24_8_ = 0;
  local_a0._32_8_ = 0;
  local_a0._40_8_ = 0;
  local_a0._48_8_ = 0;
  local_a0._56_8_ = 0;
  local_a0._64_8_ = 0;
  local_a0._72_8_ = 0;
  local_50 = (char *)0x0;
  uStack_48 = 0;
  local_b0._8_8_ = local_e0.value;
  llbuild::buildsystem::BuildValue::toData(&local_d8,(BuildValue *)local_b0);
  llbuild::core::TaskInterface::complete(&local_c0,&local_d8,false);
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)local_b0);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // Compute the signature across all of the inputs.
    using llvm::hash_combine;
    llvm::hash_code code = hash_value(path);

    // Add the signature for the actual input path.
    code = hash_combine(
        code, hash_combine_range(directoryValue.begin(), directoryValue.end()));

    // For now, we represent this task as the aggregation of all the inputs.
    for (const auto& info: childResults) {
      // We merge the children by simply combining their encoded representation.
      code = hash_combine(
          code, hash_combine_range(info.value.begin(), info.value.end()));
      if (info.directorySignatureValue.hasValue()) {
        auto& data = info.directorySignatureValue.getValue();
        code = hash_combine(
            code, hash_combine_range(data.begin(), data.end()));
      } else {
        // Combine a random number to represent nil.
        code = hash_combine(code, 0XC183979C3E98722E);
      }
    }

    // Compute the signature.
    ti.complete(BuildValue::makeDirectoryTreeSignature(
                  CommandSignature(uint64_t(code))).toData());
  }